

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

TString * __thiscall CFile::ReadWord(CFile *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  uchar tempbuf [2048];
  char local_828 [2056];
  
  __stream = (FILE *)this->fp;
  if (__stream == (FILE *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "ReadWord error: Invalid fp.";
  }
  else {
    if (this->endoffile != true) {
      while( true ) {
        uVar1 = fgetc(__stream);
        iVar2 = isspace(uVar1 & 0xff);
        if (iVar2 == 0) break;
        __stream = (FILE *)this->fp;
      }
      if (((char)uVar1 == '\'') || ((uVar1 & 0xff) == 0x22)) {
        uVar6 = uVar1 & 0x27;
        lVar7 = 0;
      }
      else {
        lVar7 = 1;
        uVar6 = 0x20;
        local_828[0] = (char)uVar1;
      }
      while( true ) {
        uVar1 = fgetc((FILE *)this->fp);
        local_828[lVar7] = (char)uVar1;
        if (uVar6 == 0x20) {
          uVar3 = isspace(uVar1 & 0xff);
        }
        else {
          uVar3 = (uint)((uVar1 & 0xff) == uVar6);
        }
        if (uVar3 != 0) break;
        lVar7 = lVar7 + 1;
        if (lVar7 == 0x800) {
          UpdateEOF(this);
          if (this->endoffile == false) {
            fprintf(_stderr,"Bug: word too long: %s",local_828);
          }
LAB_00221a81:
          return &this->result;
        }
      }
      if (uVar6 == 0x20) {
        ungetc(uVar1 & 0xff,(FILE *)this->fp);
      }
      local_828[lVar7] = '\0';
      pcVar5 = TString::GetBuffer(&this->result);
      strcpy(pcVar5,local_828);
      UpdateEOF(this);
      goto LAB_00221a81;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "ReadWord error: EOF.";
  }
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

ReadWord(void)
{
	if(!fp)
		throw "ReadWord error: Invalid fp.";
	
	if(End())
		throw "ReadWord error: EOF.";
	
	unsigned char cEnd, tempbuf[MAX_WORD_LENGTH], *pbuf;
	for(cEnd = fgetc(fp); isspace(cEnd); cEnd = fgetc(fp))
		;
	if(cEnd == '\'' || cEnd == '"')
		pbuf = &tempbuf[0];
	else
	{
		tempbuf[0] = cEnd;
		pbuf = &tempbuf[0] + 1;
		cEnd = ' ';
	}

	for(; pbuf < tempbuf + MAX_WORD_LENGTH; pbuf++)
	{
		*pbuf = fgetc(fp);

		if(cEnd == ' ' ? isspace(*pbuf) : *pbuf == cEnd) 	//if the endchar is a  ' ' we're looking for whitespace
		{													//otherwise just a match to cEnd
			if(cEnd == ' ')
				ungetc(*pbuf, fp);							//back up!

			*pbuf = '\0';
			strcpy(result.GetBuffer(), (const char *)&tempbuf[0]);
			UpdateEOF();
			return result;
		}
	}
	UpdateEOF();
	if(!End())
		fprintf(stderr, "Bug: word too long: %s", tempbuf);
	return result;
}